

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_page_search_root(MDB_cursor *mc,MDB_val *key,int flags)

{
  uint6 uVar1;
  int iVar2;
  int local_48;
  ushort local_42;
  int exact;
  indx_t i;
  MDB_node *node;
  MDB_page *pMStack_30;
  int rc;
  MDB_page *mp;
  MDB_val *pMStack_20;
  int flags_local;
  MDB_val *key_local;
  MDB_cursor *mc_local;
  
  pMStack_30 = mc->mc_pg[mc->mc_top];
  mp._4_4_ = flags;
  pMStack_20 = key;
  key_local = (MDB_val *)mc;
  while( true ) {
    if ((pMStack_30->mp_flags & 1) != 1) {
      if ((pMStack_30->mp_flags & 2) == 2) {
        *(uint *)((long)&key_local[4].mv_size + 4) = *(uint *)((long)&key_local[4].mv_size + 4) | 1;
        *(uint *)((long)&key_local[4].mv_size + 4) =
             *(uint *)((long)&key_local[4].mv_size + 4) & 0xfffffffd;
        mc_local._4_4_ = 0;
      }
      else {
        *(uint *)((long)key_local[1].mv_data + 0x7c) =
             *(uint *)((long)key_local[1].mv_data + 0x7c) | 2;
        mc_local._4_4_ = -0x784c;
      }
      return mc_local._4_4_;
    }
    if (((int)key_local[2].mv_size != 0) && ((pMStack_30->mp_pb).pb.pb_lower - 0x10 >> 1 < 2)) {
      mdb_assert_fail(*(MDB_env **)((long)key_local[1].mv_data + 0x20),
                      "!mc->mc_dbi || NUMKEYS(mp) > 1","mdb_page_search_root",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/moneroexamples[P]lmdbcpp-test/ext/liblmdb/mdb.c"
                      ,0x1789);
    }
    if ((mp._4_4_ & 0xc) == 0) {
      _exact = mdb_node_search((MDB_cursor *)key_local,pMStack_20,&local_48);
      if (_exact == (MDB_node *)0x0) {
        local_42 = (short)((pMStack_30->mp_pb).pb.pb_lower - 0x10 >> 1) - 1;
      }
      else {
        local_42 = *(ushort *)
                    ((long)&key_local[0x14].mv_data +
                    (ulong)*(ushort *)((long)&key_local[4].mv_size + 2) * 2);
        if (local_48 == 0) {
          if (local_42 == 0) {
            mdb_assert_fail(*(MDB_env **)((long)key_local[1].mv_data + 0x20),"i > 0",
                            "mdb_page_search_root",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/moneroexamples[P]lmdbcpp-test/ext/liblmdb/mdb.c"
                            ,0x1798);
          }
          local_42 = local_42 - 1;
        }
      }
    }
    else {
      local_42 = 0;
      if ((mp._4_4_ & 8) != 0) {
        local_42 = (short)((pMStack_30->mp_pb).pb.pb_lower - 0x10 >> 1) - 1;
      }
    }
    if ((pMStack_30->mp_pb).pb.pb_lower - 0x10 >> 1 <= (uint)local_42) {
      mdb_assert_fail(*(MDB_env **)((long)key_local[1].mv_data + 0x20),"i < NUMKEYS(mp)",
                      "mdb_page_search_root",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/moneroexamples[P]lmdbcpp-test/ext/liblmdb/mdb.c"
                      ,0x179f);
    }
    _exact = (MDB_node *)
             ((long)pMStack_30->mp_ptrs + (long)(int)(uint)pMStack_30->mp_ptrs[local_42] + -0x10);
    uVar1._0_2_ = _exact->mn_lo;
    uVar1._2_2_ = _exact->mn_hi;
    uVar1._4_2_ = _exact->mn_flags;
    node._4_4_ = mdb_page_get((MDB_cursor *)key_local,(ulong)uVar1,&stack0xffffffffffffffd0,
                              (int *)0x0);
    if (node._4_4_ != 0) break;
    *(ushort *)
     ((long)&key_local[0x14].mv_data + (ulong)*(ushort *)((long)&key_local[4].mv_size + 2) * 2) =
         local_42;
    node._4_4_ = mdb_cursor_push((MDB_cursor *)key_local,pMStack_30);
    if (node._4_4_ != 0) {
      return node._4_4_;
    }
    if ((mp._4_4_ & 1) != 0) {
      iVar2 = mdb_page_touch((MDB_cursor *)key_local);
      if (iVar2 != 0) {
        return iVar2;
      }
      pMStack_30 = (MDB_page *)(&key_local[4].mv_data)[*(ushort *)((long)&key_local[4].mv_size + 2)]
      ;
    }
    node._4_4_ = 0;
  }
  return node._4_4_;
}

Assistant:

static int
mdb_page_search_root(MDB_cursor *mc, MDB_val *key, int flags)
{
	MDB_page	*mp = mc->mc_pg[mc->mc_top];
	int rc;
	DKBUF;

	while (IS_BRANCH(mp)) {
		MDB_node	*node;
		indx_t		i;

		DPRINTF(("branch page %"Y"u has %u keys", mp->mp_pgno, NUMKEYS(mp)));
		/* Don't assert on branch pages in the FreeDB. We can get here
		 * while in the process of rebalancing a FreeDB branch page; we must
		 * let that proceed. ITS#8336
		 */
		mdb_cassert(mc, !mc->mc_dbi || NUMKEYS(mp) > 1);
		DPRINTF(("found index 0 to page %"Y"u", NODEPGNO(NODEPTR(mp, 0))));

		if (flags & (MDB_PS_FIRST|MDB_PS_LAST)) {
			i = 0;
			if (flags & MDB_PS_LAST)
				i = NUMKEYS(mp) - 1;
		} else {
			int	 exact;
			node = mdb_node_search(mc, key, &exact);
			if (node == NULL)
				i = NUMKEYS(mp) - 1;
			else {
				i = mc->mc_ki[mc->mc_top];
				if (!exact) {
					mdb_cassert(mc, i > 0);
					i--;
				}
			}
			DPRINTF(("following index %u for key [%s]", i, DKEY(key)));
		}

		mdb_cassert(mc, i < NUMKEYS(mp));
		node = NODEPTR(mp, i);

		if ((rc = mdb_page_get(mc, NODEPGNO(node), &mp, NULL)) != 0)
			return rc;

		mc->mc_ki[mc->mc_top] = i;
		if ((rc = mdb_cursor_push(mc, mp)))
			return rc;

		if (flags & MDB_PS_MODIFY) {
			if ((rc = mdb_page_touch(mc)) != 0)
				return rc;
			mp = mc->mc_pg[mc->mc_top];
		}
	}

	if (!IS_LEAF(mp)) {
		DPRINTF(("internal error, index points to a %02X page!?",
		    mp->mp_flags));
		mc->mc_txn->mt_flags |= MDB_TXN_ERROR;
		return MDB_CORRUPTED;
	}

	DPRINTF(("found leaf page %"Y"u for key [%s]", mp->mp_pgno,
	    key ? DKEY(key) : "null"));
	mc->mc_flags |= C_INITIALIZED;
	mc->mc_flags &= ~C_EOF;

	return MDB_SUCCESS;
}